

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

xmlAttrPtr xmlC14NFindHiddenParentAttr(xmlC14NCtxPtr ctx,xmlNodePtr cur,xmlChar *name,xmlChar *ns)

{
  int iVar1;
  xmlAttrPtr pxVar2;
  xmlAttrPtr pxVar3;
  
  pxVar3 = (xmlAttrPtr)0x0;
  while ((((pxVar2 = pxVar3, cur != (xmlNode *)0x0 &&
           (ctx->is_visible_callback != (xmlC14NIsVisibleCallback)0x0)) &&
          (iVar1 = (*ctx->is_visible_callback)(ctx->user_data,cur,cur->parent), iVar1 == 0)) &&
         (pxVar2 = xmlHasNsProp(cur,name,(xmlChar *)"http://www.w3.org/XML/1998/namespace"),
         pxVar2 == (xmlAttrPtr)0x0))) {
    cur = cur->parent;
  }
  return pxVar2;
}

Assistant:

static xmlAttrPtr
xmlC14NFindHiddenParentAttr(xmlC14NCtxPtr ctx, xmlNodePtr cur, const xmlChar * name, const xmlChar * ns)
{
    xmlAttrPtr res;
    while((cur != NULL) && (!xmlC14NIsVisible(ctx, cur, cur->parent))) {
        res = xmlHasNsProp(cur, name, ns);
        if(res != NULL) {
            return res;
        }

        cur = cur->parent;
    }

    return NULL;
}